

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O1

int __thiscall amrex::MultiCutFab::remove(MultiCutFab *this,char *__filename)

{
  int extraout_EAX;
  BaseFab<double> *this_00;
  int *piVar1;
  MFIter mfi;
  MFIter MStack_88;
  
  MFIter::MFIter(&MStack_88,(FabArrayBase *)this,'\0');
  if (MStack_88.currentIndex < MStack_88.endIndex) {
    do {
      piVar1 = &MStack_88.currentIndex;
      if (MStack_88.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar1 = ((MStack_88.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + MStack_88.currentIndex;
      }
      if (*(int *)&((this->m_cellflags->m_fabs_v).
                    super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[*piVar1]->
                   super_BaseFab<amrex::EBCellFlag>).field_0x44 != 1) {
        this_00 = (BaseFab<double> *)FabArray<amrex::CutFab>::release(&this->m_data,&MStack_88);
        if (this_00 != (BaseFab<double> *)0x0) {
          this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
          BaseFab<double>::clear(this_00);
          operator_delete(this_00,0x48);
        }
      }
      MFIter::operator++(&MStack_88);
    } while (MStack_88.currentIndex < MStack_88.endIndex);
  }
  MFIter::~MFIter(&MStack_88);
  return extraout_EAX;
}

Assistant:

void
MultiCutFab::remove ()
{
    for (MFIter mfi(m_data); mfi.isValid(); ++mfi)
    {
        if (!ok(mfi))
        {
            delete m_data.release(mfi);
        }
    }
}